

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextFile.cpp
# Opt level: O0

TextFile * __thiscall asl::TextFile::operator>>(TextFile *this,String *x)

{
  uint uVar1;
  int in_EDX;
  char local_128 [4];
  int n;
  char s [256];
  String *x_local;
  TextFile *this_local;
  
  if (((this->super_File)._file != (FILE *)0x0) ||
     (uVar1 = open(this,(char *)0x0,in_EDX), (uVar1 & 1) != 0)) {
    __isoc99_fscanf((this->super_File)._file,"%255s",local_128);
    asl::String::operator=(x,local_128);
  }
  return this;
}

Assistant:

TextFile& TextFile::operator>>(String &x)
{
	if(!_file && !open(READ))
		return *this;
	char s[256];
	int n = fscanf(_file, "%255s", s); if (n < 1) {}
	x = &s[0];
	return *this;
}